

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>::Maybe
          (Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *this,
          Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_> *other)

{
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::LocatedInteger>_>::NullableValue
            (&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }